

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::InvalidAlignmentTest::InvalidAlignmentTest
          (InvalidAlignmentTest *this,Context *context)

{
  GLuint GVar1;
  GLuint GVar2;
  GLuint GVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  GLuint *pGVar7;
  GLuint h_val;
  GLuint w;
  long lVar8;
  testCase src_test_case;
  testCase dst_test_case;
  value_type local_68;
  value_type local_4c;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"invalid_alignment",
             "Test verifies if INVALID_VALUE is generated when CopySubImageData is executed for regions with invalid alignment"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InvalidAlignmentTest_01db4e38;
  this->m_dst_tex_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
    GVar1 = InvalidAlignmentTest(deqp::Context&)::y_vals[lVar6];
    for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
      GVar2 = InvalidAlignmentTest(deqp::Context&)::y_vals[lVar5];
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        pGVar7 = InvalidAlignmentTest(deqp::Context&)::w_vals;
        GVar3 = InvalidAlignmentTest(deqp::Context&)::w_vals[lVar4];
        for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
          local_68.m_width = *pGVar7;
          local_68.m_expected_result = 0x501;
          if ((((int)lVar5 == 0 && (int)lVar6 == 0) && (int)lVar4 == 0) && (int)lVar8 == 0) {
            local_68.m_expected_result = 0;
          }
          local_4c.m_src_x = 0;
          local_4c.m_src_y = 0;
          local_68.m_dst_x = 0;
          local_68.m_dst_y = 0;
          local_68.m_height = GVar3;
          local_68.m_src_x = GVar1;
          local_68.m_src_y = GVar2;
          local_4c.m_height = GVar3;
          local_4c.m_width = local_68.m_width;
          local_4c.m_dst_x = GVar1;
          local_4c.m_dst_y = GVar2;
          local_4c.m_expected_result = local_68.m_expected_result;
          std::
          vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_4c);
          std::
          vector<gl4cts::CopyImage::InvalidAlignmentTest::testCase,_std::allocator<gl4cts::CopyImage::InvalidAlignmentTest::testCase>_>
          ::push_back(&this->m_test_cases,&local_68);
          pGVar7 = pGVar7 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

InvalidAlignmentTest::InvalidAlignmentTest(deqp::Context& context)
	: TestCase(context, "invalid_alignment", "Test verifies if INVALID_VALUE is generated when CopySubImageData is "
											 "executed for regions with invalid alignment")
	, m_dst_tex_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* 16x16x6 are values used by prepareTex16x16x6 */
	static const GLuint invalid_h = 2;
	static const GLuint invalid_w = 2;
	static const GLuint invalid_x = 2;
	static const GLuint invalid_y = 2;
	static const GLuint valid_h   = 4;
	static const GLuint valid_w   = 4;

	static const GLuint h_vals[] = { valid_h, invalid_h };
	static const GLuint w_vals[] = { valid_w, invalid_w };
	static const GLuint x_vals[] = { 0, invalid_x };
	static const GLuint y_vals[] = { 0, invalid_y };

	static const GLuint n_h_vals = sizeof(h_vals) / sizeof(h_vals[0]);
	static const GLuint n_w_vals = sizeof(w_vals) / sizeof(w_vals[0]);
	static const GLuint n_x_vals = sizeof(x_vals) / sizeof(x_vals[0]);
	static const GLuint n_y_vals = sizeof(y_vals) / sizeof(y_vals[0]);

	for (GLuint x = 0; x < n_x_vals; ++x)
	{
		for (GLuint y = 0; y < n_y_vals; ++y)
		{
			for (GLuint h = 0; h < n_h_vals; ++h)
			{
				for (GLuint w = 0; w < n_w_vals; ++w)
				{
					const GLuint h_val = h_vals[h];
					const GLuint w_val = w_vals[w];
					const GLuint x_val = x_vals[x];
					const GLuint y_val = y_vals[y];
					const GLenum res   = ((valid_h == h_val) && (valid_w == w_val) && (0 == x_val) && (0 == y_val)) ?
										   GL_NO_ERROR :
										   GL_INVALID_VALUE;

					testCase dst_test_case = { h_val, w_val, 0, 0, x_val, y_val, res };

					testCase src_test_case = { h_val, w_val, x_val, y_val, 0, 0, res };

					m_test_cases.push_back(dst_test_case);
					m_test_cases.push_back(src_test_case);
				}
			}
		}
	}
}